

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall llbuild::ninja::Lexer::lexPathString(Lexer *this,Token *result)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    while( true ) {
      if (this->bufferPos == (this->buffer).Data + (this->buffer).Length) {
        iVar2 = -1;
      }
      else {
        iVar2 = (int)*this->bufferPos;
      }
      if (iVar2 != 0x24) break;
      getNextChar(this);
      iVar2 = getNextChar(this);
      if (iVar2 == 10) {
        while( true ) {
          if (this->bufferPos == (this->buffer).Data + (this->buffer).Length) {
            iVar2 = -1;
          }
          else {
            iVar2 = (int)*this->bufferPos;
          }
          iVar1 = isspace(iVar2);
          if (((iVar1 == 0) || (iVar2 == 10)) || (iVar2 == 0xd)) break;
          getNextChar(this);
        }
      }
    }
    iVar1 = isspace(iVar2);
    if ((((iVar1 != 0) || (iVar2 == -1)) || (iVar2 == 0x3a)) || (iVar2 == 0x7c)) break;
    getNextChar(this);
  }
  result->tokenKind = String;
  result->length = *(int *)&this->bufferPos - *(int *)&result->start;
  return result;
}

Assistant:

Token &Lexer::lexPathString(Token &result) {
  // String tokens in path contexts consume until a space, ':', or '|'
  // character.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.

      // Consume the next character.
      c = getNextChar();

      // If the character was a newline, consume any leading spaces.
      if (c == '\n') {
        while (isNonNewlineSpace(peekNextChar()))
          getNextChar();
      }

      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (isspace(c) || c == ':' || c == '|' || c == -1)
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}